

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O1

int tcv_get_vendor_sn(tcv_t *tcv,char *vendor_sn)

{
  int iVar1;
  bool bVar2;
  
  if ((tcv == (tcv_t *)0x0) || (tcv->created != true)) {
    bVar2 = false;
  }
  else {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    bVar2 = iVar1 == 0;
  }
  iVar1 = -4;
  if ((vendor_sn != (char *)0x0) && (bVar2)) {
    iVar1 = -0xd;
    if ((tcv != (tcv_t *)0x0) && ((tcv->created == true && (tcv->initialized == true)))) {
      iVar1 = (*tcv->fun->get_vendor_serial_number)(tcv,vendor_sn);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
  }
  return iVar1;
}

Assistant:

int tcv_get_vendor_sn(tcv_t *tcv, char* vendor_sn)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !vendor_sn)
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_vendor_serial_number(tcv, vendor_sn);
	}
	tcv_unlock(tcv);
	return ret;
}